

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<unsigned_long_long>::reallocate
          (QPodArrayOps<unsigned_long_long> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  unsigned_long_long *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<unsigned_long_long>_*,_unsigned_long_long_*> pVar2;
  pair<QTypedArrayData<unsigned_long_long>_*,_unsigned_long_long_*> pair;
  unsigned_long_long *puStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<unsigned_long_long>::reallocateUnaligned
                    ((QTypedArrayData<unsigned_long_long> *)0xaaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX)
  ;
  qt_noop();
  *in_RDI = (unsigned_long_long)pVar2.first;
  puStack_10 = pVar2.second;
  in_RDI[1] = (unsigned_long_long)puStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }